

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Fault f_1;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  Fault local_50;
  DebugComparison<unsigned_long,_unsigned_long_&> local_48;
  EVP_PKEY_CTX *local_20;
  uchar *local_18;
  size_t local_10;
  
  local_20 = ctx;
  local_18 = sig;
  local_10 = siglen;
  local_48.left =
       verifyNode(this,(size_t)ctx,(FunctionParam<bool_(unsigned_int,_unsigned_int)> *)&local_18,0,
                  this->height,(MaybeUint)0x0);
  local_48.op.content.ptr = " == ";
  local_48.result = (EVP_PKEY_CTX *)local_48.left == local_20;
  local_48.op.content.size_ = 5;
  if (local_48.result) {
    return (int)local_48.left;
  }
  local_48.right = (unsigned_long *)&local_20;
  Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&>
            (&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,(char  [7])0xa8,FAILED,"verifyNode(size, f, 0, height, nullptr) == size",
             "_kjCondition,",&local_48);
  Debug::Fault::fatal(&local_50);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}